

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O0

int setup_dp(X509 *x,DIST_POINT *dp)

{
  GENERAL_NAME *pGVar1;
  GENERAL_NAME *gen;
  size_t i;
  X509_NAME *iname;
  DIST_POINT *dp_local;
  X509 *x_local;
  
  if ((dp->distpoint == (DIST_POINT_NAME *)0x0) || (dp->distpoint->type != 1)) {
    x_local._4_4_ = 1;
  }
  else {
    i = 0;
    gen = (GENERAL_NAME *)0x0;
    while( true ) {
      pGVar1 = (GENERAL_NAME *)sk_GENERAL_NAME_num(dp->CRLissuer);
      if (pGVar1 <= gen) break;
      pGVar1 = sk_GENERAL_NAME_value(dp->CRLissuer,(size_t)gen);
      if (pGVar1->type == 4) {
        i = *(size_t *)&pGVar1->d;
        break;
      }
      gen = (GENERAL_NAME *)((long)&gen->type + 1);
    }
    if (i == 0) {
      i = (size_t)X509_get_issuer_name((X509 *)x);
    }
    x_local._4_4_ = DIST_POINT_set_dpname((DIST_POINT_NAME *)dp->distpoint,(X509_NAME *)i);
  }
  return x_local._4_4_;
}

Assistant:

static int setup_dp(X509 *x, DIST_POINT *dp) {
  if (!dp->distpoint || (dp->distpoint->type != 1)) {
    return 1;
  }
  X509_NAME *iname = NULL;
  for (size_t i = 0; i < sk_GENERAL_NAME_num(dp->CRLissuer); i++) {
    GENERAL_NAME *gen = sk_GENERAL_NAME_value(dp->CRLissuer, i);
    if (gen->type == GEN_DIRNAME) {
      iname = gen->d.directoryName;
      break;
    }
  }
  if (!iname) {
    iname = X509_get_issuer_name(x);
  }

  return DIST_POINT_set_dpname(dp->distpoint, iname);
}